

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_c.cpp
# Opt level: O1

spvc_result spvc_compiler_set_enabled_interface_variables(spvc_compiler compiler,spvc_set set)

{
  Compiler *this;
  __alloc_node_gen_t __alloc_node_gen;
  _AllocNode<std::allocator<std::__detail::_Hash_node<spirv_cross::TypedID<(spirv_cross::Types)2>,_true>_>_>
  local_58;
  _Hashtable<spirv_cross::TypedID<(spirv_cross::Types)2>,_spirv_cross::TypedID<(spirv_cross::Types)2>,_std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::__detail::_Identity,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_50;
  
  this = (compiler->compiler)._M_t.
         super___uniq_ptr_impl<spirv_cross::Compiler,_std::default_delete<spirv_cross::Compiler>_>.
         _M_t.
         super__Tuple_impl<0UL,_spirv_cross::Compiler_*,_std::default_delete<spirv_cross::Compiler>_>
         .super__Head_base<0UL,_spirv_cross::Compiler_*,_false>._M_head_impl;
  local_58._M_h = (__hashtable_alloc *)&local_50;
  local_50._M_buckets = (__buckets_ptr)0x0;
  local_50._M_bucket_count = (set->set)._M_h._M_bucket_count;
  local_50._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_50._M_element_count = (set->set)._M_h._M_element_count;
  local_50._M_rehash_policy._M_max_load_factor = (set->set)._M_h._M_rehash_policy._M_max_load_factor
  ;
  local_50._M_rehash_policy._4_4_ = *(undefined4 *)&(set->set)._M_h._M_rehash_policy.field_0x4;
  local_50._M_rehash_policy._M_next_resize = (set->set)._M_h._M_rehash_policy._M_next_resize;
  local_50._M_single_bucket = (__node_base_ptr)0x0;
  std::
  _Hashtable<spirv_cross::TypedID<(spirv_cross::Types)2>,spirv_cross::TypedID<(spirv_cross::Types)2>,std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>>,std::__detail::_Identity,std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>>,std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::
  _M_assign<std::_Hashtable<spirv_cross::TypedID<(spirv_cross::Types)2>,spirv_cross::TypedID<(spirv_cross::Types)2>,std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>>,std::__detail::_Identity,std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>>,std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<spirv_cross::TypedID<(spirv_cross::Types)2>,true>>>>
            ((_Hashtable<spirv_cross::TypedID<(spirv_cross::Types)2>,spirv_cross::TypedID<(spirv_cross::Types)2>,std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>>,std::__detail::_Identity,std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>>,std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              *)local_58._M_h,&(set->set)._M_h,&local_58);
  spirv_cross::Compiler::set_enabled_interface_variables
            (this,(unordered_set<spirv_cross::TypedID<(spirv_cross::Types)2>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>_>_>
                   *)&local_50);
  std::
  _Hashtable<spirv_cross::TypedID<(spirv_cross::Types)2>,_spirv_cross::TypedID<(spirv_cross::Types)2>,_std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::__detail::_Identity,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_50);
  return SPVC_SUCCESS;
}

Assistant:

spvc_result spvc_compiler_set_enabled_interface_variables(spvc_compiler compiler, spvc_set set)
{
	SPVC_BEGIN_SAFE_SCOPE
	{
		compiler->compiler->set_enabled_interface_variables(set->set);
	}